

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_quantize_init(ggml_type type)

{
  int grid_size;
  
  ggml_critical_section_start();
  if (type < GGML_TYPE_BF16) {
    if ((0x204b0000U >> (type & (GGML_TYPE_BF16|GGML_TYPE_F16)) & 1) == 0) {
      if (type == GGML_TYPE_IQ3_XXS) {
        grid_size = 0x100;
      }
      else {
        if (type != GGML_TYPE_IQ3_S) goto LAB_00123061;
        grid_size = 0x200;
      }
      iq3xs_init_impl(grid_size);
    }
    else {
      iq2xs_init_impl(type);
    }
  }
LAB_00123061:
  ggml_critical_section_end();
  return;
}

Assistant:

void ggml_quantize_init(enum ggml_type type) {
    ggml_critical_section_start();

    switch (type) {
        case GGML_TYPE_IQ2_XXS:
        case GGML_TYPE_IQ2_XS:
        case GGML_TYPE_IQ2_S:
        case GGML_TYPE_IQ1_S:
        case GGML_TYPE_IQ1_M:   iq2xs_init_impl(type); break;
        case GGML_TYPE_IQ3_XXS: iq3xs_init_impl(256); break;
        case GGML_TYPE_IQ3_S:   iq3xs_init_impl(512); break;
        default: // nothing
            break;
    }

    ggml_critical_section_end();
}